

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

BYTE * __thiscall FFontChar2::GetColumn(FFontChar2 *this,uint column,Span **spans_out)

{
  Span **ppSVar1;
  ulong uVar2;
  
  if (this->Pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  uVar2 = (ulong)(this->super_FTexture).WidthMask;
  if (column < (this->super_FTexture).Width) {
    uVar2 = (ulong)column;
  }
  if (spans_out != (Span **)0x0) {
    ppSVar1 = this->Spans;
    if (ppSVar1 == (Span **)0x0) {
      ppSVar1 = FTexture::CreateSpans(&this->super_FTexture,this->Pixels);
      this->Spans = ppSVar1;
    }
    *spans_out = ppSVar1[uVar2];
  }
  return this->Pixels + (int)uVar2 * (uint)(this->super_FTexture).Height;
}

Assistant:

const BYTE *FFontChar2::GetColumn (unsigned int column, const Span **spans_out)
{
	if (Pixels == NULL)
	{
		MakeTexture ();
	}
	if (column >= Width)
	{
		column = WidthMask;
	}
	if (spans_out != NULL)
	{
		if (Spans == NULL)
		{
			Spans = CreateSpans (Pixels);
		}
		*spans_out = Spans[column];
	}
	return Pixels + column*Height;
}